

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O1

bool common::ReadSettings
               (path *path,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *values,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *errors)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  ssize_t sVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar7;
  pointer pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_bool>
  pVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  pVar13;
  SettingsValue in;
  ifstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  vector<UniValue,_std::allocator<UniValue>_> vStack_278;
  string local_260;
  long local_240 [4];
  byte abStack_220 [200];
  undefined8 auStack_158 [36];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::clear(&values->_M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(errors,(errors->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  cVar3 = std::filesystem::status(&path->super_path);
  bVar11 = true;
  if ((cVar3 == '\0') || (cVar3 == -1)) goto LAB_0013d863;
  std::ifstream::ifstream(local_240);
  std::ifstream::open((char *)local_240,
                      (_Ios_Openmode)(path->super_path)._M_pathname._M_dataplus._M_p);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    pcVar2 = (path->super_path)._M_pathname._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,pcVar2,pcVar2 + (path->super_path)._M_pathname._M_string_length)
    ;
    tinyformat::format<std::__cxx11::string>
              ((string *)local_2b8,(tinyformat *)"%s. Please check permissions.",(char *)&local_260,
               in_RCX);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    if ((undefined1 *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_) != local_2b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_),local_2b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    bVar11 = false;
  }
  else {
    local_2b8._8_8_ = &local_2a0;
    local_2b8._16_8_ = 0;
    local_2a0._M_local_buf[0] = '\0';
    local_2b8._0_4_ = VNULL;
    local_290.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_290.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_290.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_278.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_278.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_278.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_260.field_2;
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffff;
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_260,
               *(undefined8 *)((long)auStack_158 + *(long *)(local_240[0] + -0x18)),0xffffffff);
    sVar4 = UniValue::read((UniValue *)local_2b8,(int)local_260._M_string_length,
                           local_260._M_dataplus._M_p,(size_t)args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((char)sVar4 == '\0') {
      pcVar2 = (path->super_path)._M_pathname._M_dataplus._M_p;
      local_2d8._0_8_ = local_2d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d8,pcVar2,pcVar2 + (path->super_path)._M_pathname._M_string_length
                );
      tinyformat::format<std::__cxx11::string>
                (&local_260,
                 (tinyformat *)
                 "Settings file %s does not contain valid JSON. This is probably caused by disk corruption or a crash, and can be fixed by removing the file, which will reset settings to default values."
                 ,local_2d8,args);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                 &local_260);
LAB_0013d7ed:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != paVar1) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
LAB_0013d814:
        operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
      }
LAB_0013d821:
      bVar11 = false;
    }
    else {
      if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) != 0) {
        pcVar2 = (path->super_path)._M_pathname._M_dataplus._M_p;
        local_2d8._0_8_ = local_2d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d8,pcVar2,
                   pcVar2 + (path->super_path)._M_pathname._M_string_length);
        tinyformat::format<std::__cxx11::string>
                  (&local_260,(tinyformat *)"Failed reading settings file %s",local_2d8,args);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                   &local_260);
        goto LAB_0013d7ed;
      }
      std::ifstream::close();
      if (local_2b8._0_4_ != VOBJ) {
        UniValue::write_abi_cxx11_((UniValue *)local_2d8,(int)local_2b8,(void *)0x0,0);
        pcVar2 = (path->super_path)._M_pathname._M_dataplus._M_p;
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f8,pcVar2,
                   pcVar2 + (path->super_path)._M_pathname._M_string_length);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_260,(tinyformat *)"Found non-object value %s in settings file %s",
                   local_2d8,&local_2f8,args_1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                   &local_260);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != paVar1) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) goto LAB_0013d814;
        goto LAB_0013d821;
      }
      pvVar5 = UniValue::getKeys_abi_cxx11_((UniValue *)local_2b8);
      pvVar6 = UniValue::getValues((UniValue *)local_2b8);
      pbVar8 = (pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar5->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pbVar8) {
        lVar10 = 0;
        lVar7 = 0;
        uVar9 = 0;
        do {
          pVar12 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue>,std::_Select1st<std::pair<std::__cxx11::string_const,UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>
                   ::_M_emplace_unique<std::__cxx11::string_const&,UniValue_const&>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,UniValue>,std::_Select1st<std::pair<std::__cxx11::string_const,UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>
                               *)values,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pbVar8->_M_dataplus)._M_p + lVar7),
                              (UniValue *)
                              ((long)&((pvVar6->
                                       super__Vector_base<UniValue,_std::allocator<UniValue>_>).
                                       _M_impl.super__Vector_impl_data._M_start)->typ + lVar10));
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            pbVar8 = (pvVar5->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pcVar2 = (path->super_path)._M_pathname._M_dataplus._M_p;
            local_2d8._0_8_ = local_2d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2d8,pcVar2,
                       pcVar2 + (path->super_path)._M_pathname._M_string_length);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_260,(tinyformat *)"Found duplicate key %s in settings file %s",
                       (char *)((long)&(pbVar8->_M_dataplus)._M_p + lVar7),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d8,args_1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                       &local_260);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
              operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            ::clear(&values->_M_t);
            break;
          }
          uVar9 = uVar9 + 1;
          pbVar8 = (pvVar5->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar7 = lVar7 + 0x20;
          lVar10 = lVar10 + 0x58;
        } while (uVar9 < (ulong)((long)(pvVar5->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >>
                                5));
      }
      pVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               ::equal_range(&values->_M_t,
                             (key_type *)&(anonymous_namespace)::SETTINGS_WARN_MSG_KEY_abi_cxx11_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
      ::_M_erase_aux(&values->_M_t,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node)
      ;
      bVar11 = (errors->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start ==
               (errors->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_278);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._8_8_ != &local_2a0) {
      operator_delete((void *)local_2b8._8_8_,
                      CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]) + 1)
      ;
    }
  }
  std::ifstream::~ifstream(local_240);
LAB_0013d863:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

bool ReadSettings(const fs::path& path, std::map<std::string, SettingsValue>& values, std::vector<std::string>& errors)
{
    values.clear();
    errors.clear();

    // Ok for file to not exist
    if (!fs::exists(path)) return true;

    std::ifstream file;
    file.open(path);
    if (!file.is_open()) {
      errors.emplace_back(strprintf("%s. Please check permissions.", fs::PathToString(path)));
      return false;
    }

    SettingsValue in;
    if (!in.read(std::string{std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>()})) {
        errors.emplace_back(strprintf("Settings file %s does not contain valid JSON. This is probably caused by disk corruption or a crash, "
                                      "and can be fixed by removing the file, which will reset settings to default values.",
                                      fs::PathToString(path)));
        return false;
    }

    if (file.fail()) {
        errors.emplace_back(strprintf("Failed reading settings file %s", fs::PathToString(path)));
        return false;
    }
    file.close(); // Done with file descriptor. Release while copying data.

    if (!in.isObject()) {
        errors.emplace_back(strprintf("Found non-object value %s in settings file %s", in.write(), fs::PathToString(path)));
        return false;
    }

    const std::vector<std::string>& in_keys = in.getKeys();
    const std::vector<SettingsValue>& in_values = in.getValues();
    for (size_t i = 0; i < in_keys.size(); ++i) {
        auto inserted = values.emplace(in_keys[i], in_values[i]);
        if (!inserted.second) {
            errors.emplace_back(strprintf("Found duplicate key %s in settings file %s", in_keys[i], fs::PathToString(path)));
            values.clear();
            break;
        }
    }

    // Remove auto-generated warning comment from the accessible settings.
    values.erase(SETTINGS_WARN_MSG_KEY);

    return errors.empty();
}